

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::MidiFile(MidiFile *this)

{
  MidiEventList *this_00;
  long lVar1;
  
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ticksPerQuarterNote = 0x78;
  this->m_trackCount = 1;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  (this->m_readFileName)._M_dataplus._M_p = (pointer)&(this->m_readFileName).field_2;
  (this->m_readFileName)._M_string_length = 0;
  (this->m_readFileName).field_2._M_local_buf[0] = '\0';
  this->m_timemapvalid = false;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  if (0 < this->m_trackCount) {
    lVar1 = 0;
    do {
      this_00 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(this_00);
      (this->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1] = this_00;
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->m_trackCount);
  }
  return;
}

Assistant:

MidiFile::MidiFile(void) {
	m_events.resize(m_trackCount);
	for (int i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}
}